

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableMessageOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  long lVar1;
  uint32 number;
  
  WriteUInt32ToUtf16CharSequence
            (*(uint32 *)((this->super_ImmutableMessageFieldLiteGenerator).descriptor_ + 0x44),output
            );
  number = GetExperimentalJavaFieldType
                     ((this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  lVar1 = *(long *)((this->super_ImmutableMessageFieldLiteGenerator).descriptor_ + 0x58);
  WriteUInt32ToUtf16CharSequence
            ((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 4) * -0x55555555,
             output);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldLiteGenerator).variables_,
                     "$oneof_stored_type$.class,\n");
  return;
}

Assistant:

void ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  printer->Print(variables_, "$oneof_stored_type$.class,\n");
}